

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixpoint.cpp
# Opt level: O0

int32_t fix_Div(int32_t i,int32_t j,int32_t q)

{
  __type _Var1;
  __type _Var2;
  __type _Var3;
  double dVar4;
  int32_t q_local;
  int32_t j_local;
  int32_t i_local;
  
  _Var1 = std::pow<double,int>(2.0,q);
  _Var2 = std::pow<double,int>(2.0,q);
  _Var3 = std::pow<double,int>(2.0,q);
  dVar4 = round((((double)i / _Var1) / ((double)j / _Var2)) * _Var3);
  return (int)dVar4;
}

Assistant:

int32_t fix_Div(int32_t i, int32_t j, int32_t q)
{
	return double2fix(fix2double(i, q) / fix2double(j, q), q);
}